

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnStructType
          (BinaryReaderLogging *this,Index index,Index field_count,TypeMut *fields)

{
  Enum EVar1;
  long lVar2;
  TypeMut field;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnStructType(index: %u, fields: ",index);
  Stream::Writef(this->stream_,"[");
  for (lVar2 = 0; (ulong)field_count * 0xc - lVar2 != 0; lVar2 = lVar2 + 0xc) {
    field._8_4_ = *(undefined4 *)(&fields->mutable_ + lVar2);
    field.type = *(Type *)((long)&(fields->type).enum_ + lVar2);
    LogField(this,field);
    if ((ulong)(field_count - 1) * 0xc - lVar2 != 0) {
      Stream::Writef(this->stream_,", ");
    }
  }
  Stream::Writef(this->stream_,"])\n");
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0xc])
                    (this->reader_,(ulong)index,(ulong)field_count,fields);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnStructType(Index index,
                                         Index field_count,
                                         TypeMut* fields) {
  LOGF("OnStructType(index: %" PRIindex ", fields: ", index);
  LOGF_NOINDENT("[");
  for (Index i = 0; i < field_count; ++i) {
    LogField(fields[i]);
    if (i != field_count - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("])\n");
  return reader_->OnStructType(index, field_count, fields);
}